

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

int __thiscall
Al::internal::ProgressEngine::bind(ProgressEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  MPICommunicator *pMVar3;
  ostream *poVar4;
  undefined8 uVar5;
  hwloc_obj_t phVar6;
  undefined8 uVar7;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  hwloc_cpuset_t coreset;
  hwloc_obj_t core;
  hwloc_cpuset_t cpuset;
  hwloc_topology_t topo;
  uint in_stack_ffffffffffffffc8;
  hwloc_obj_type_t in_stack_ffffffffffffffcc;
  hwloc_topology_t in_stack_ffffffffffffffd8;
  undefined8 local_10;
  ProgressEngine *local_8;
  
  local_8 = this;
  if (this->core_to_bind < 0) {
    pMVar3 = mpi::get_world_comm();
    iVar2 = MPICommAndStreamWrapper<int>::rank(&pMVar3->super_MPICommAndStreamWrapper<int>);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar2);
    poVar4 = std::operator<<(poVar4,": progress engine binding not initialized");
    iVar2 = std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    hwloc_topology_init(&local_10,CONCAT44(in_register_00000034,__fd),__addr,
                        CONCAT44(in_register_0000000c,__len));
    hwloc_topology_load(local_10);
    uVar5 = hwloc_bitmap_alloc();
    bVar1 = anon_unknown_5::get_hwloc_cpuset
                      ((hwloc_cpuset_t *)in_stack_ffffffffffffffd8,(hwloc_topology_t *)this);
    if (bVar1) {
      phVar6 = hwloc_get_obj_inside_cpuset_by_type
                         (in_stack_ffffffffffffffd8,(hwloc_const_cpuset_t)this,
                          in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (phVar6 == (hwloc_obj_t)0x0) {
        pMVar3 = mpi::get_world_comm();
        iVar2 = MPICommAndStreamWrapper<int>::rank(&pMVar3->super_MPICommAndStreamWrapper<int>);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar2);
        poVar4 = std::operator<<(poVar4,": could not get core ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->core_to_bind);
        poVar4 = std::operator<<(poVar4,"; not binding progress thread");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        hwloc_bitmap_free(uVar5);
        iVar2 = hwloc_topology_destroy(local_10);
      }
      else {
        uVar7 = hwloc_bitmap_dup(phVar6->cpuset);
        hwloc_bitmap_singlify(uVar7);
        iVar2 = hwloc_set_cpubind(local_10,uVar7,2);
        if (iVar2 == -1) {
          pMVar3 = mpi::get_world_comm();
          iVar2 = MPICommAndStreamWrapper<int>::rank(&pMVar3->super_MPICommAndStreamWrapper<int>);
          poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar2);
          poVar4 = std::operator<<(poVar4,": failed to bind progress thread");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        hwloc_bitmap_free(uVar7);
        hwloc_bitmap_free(uVar5);
        iVar2 = hwloc_topology_destroy(local_10);
      }
    }
    else {
      pMVar3 = mpi::get_world_comm();
      iVar2 = MPICommAndStreamWrapper<int>::rank(&pMVar3->super_MPICommAndStreamWrapper<int>);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar2);
      poVar4 = std::operator<<(poVar4,": Could not get starting cpuset; not binding progress thread"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      hwloc_bitmap_free(uVar5);
      iVar2 = hwloc_topology_destroy(local_10);
    }
  }
  return iVar2;
}

Assistant:

void ProgressEngine::bind() {
  if (core_to_bind < 0) {
    std::cerr << mpi::get_world_comm().rank()
              << ": progress engine binding not initialized"
              << std::endl;
    return;
  }

  hwloc_topology_t topo;
  hwloc_topology_init(&topo);
  hwloc_topology_load(topo);
  hwloc_cpuset_t cpuset = hwloc_bitmap_alloc();
  if (!get_hwloc_cpuset(cpuset, topo)) {
    std::cerr << mpi::get_world_comm().rank()
              << ": Could not get starting cpuset; not binding progress thread"
              << std::endl;
    hwloc_bitmap_free(cpuset);
    hwloc_topology_destroy(topo);
    return;
  }

  hwloc_obj_t core = hwloc_get_obj_inside_cpuset_by_type(
    topo, cpuset, HWLOC_OBJ_CORE, core_to_bind);
  if (core == NULL) {
    std::cerr << mpi::get_world_comm().rank()
              << ": could not get core "
              << core_to_bind
              << "; not binding progress thread"
              << std::endl;
    hwloc_bitmap_free(cpuset);
    hwloc_topology_destroy(topo);
    return;
  }
  hwloc_cpuset_t coreset = hwloc_bitmap_dup(core->cpuset);
  hwloc_bitmap_singlify(coreset);
  if (hwloc_set_cpubind(topo, coreset, HWLOC_CPUBIND_THREAD) == -1) {
    std::cerr << mpi::get_world_comm().rank()
              << ": failed to bind progress thread"
              << std::endl;
  }

  hwloc_bitmap_free(coreset);
  hwloc_bitmap_free(cpuset);
  hwloc_topology_destroy(topo);
}